

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O1

int gost_imit_ctrl(EVP_MD_CTX *ctx,int type,int arg,void *ptr)

{
  int iVar1;
  gost_ctx *c;
  EVP_MD *pEVar2;
  code *pcVar3;
  ASN1_OBJECT *obj;
  gost_cipher_info *pgVar4;
  long lVar5;
  int reason;
  
  if (type == 3) {
    lVar5 = EVP_MD_CTX_get0_md_data(ctx);
    if (arg - 9U < 0xfffffff8) {
      reason = 0x75;
      iVar1 = 0x65a;
      goto LAB_0011360d;
    }
    *(int *)(lVar5 + 0x1080) = arg;
  }
  else if (type == 0x1004) {
    c = (gost_ctx *)EVP_MD_CTX_get0_md_data(ctx);
    pEVar2 = EVP_MD_CTX_md((EVP_MD_CTX *)ctx);
    pcVar3 = (code *)EVP_MD_meth_get_init(pEVar2);
    iVar1 = (*pcVar3)(ctx);
    if (iVar1 < 1) {
      reason = 0x79;
      iVar1 = 0x639;
LAB_0011360d:
      ERR_GOST_error(0x71,reason,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                     ,iVar1);
      return 0;
    }
    EVP_MD_CTX_set_flags((EVP_MD_CTX *)ctx,0x100);
    if (arg != 0x20) {
      if (arg != 0) {
        reason = 0x73;
        iVar1 = 0x653;
        goto LAB_0011360d;
      }
      if (*ptr != 0) {
        obj = OBJ_nid2obj(*ptr);
        pgVar4 = get_encryption_params((ASN1_OBJECT *)obj);
        if (pgVar4 == (gost_cipher_info *)0x0) {
          ERR_GOST_error(0x71,0x74,
                         "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_crypt.c"
                         ,0x645);
          return 0;
        }
        gost_init(c,pgVar4->sblock);
      }
      ptr = (void *)((long)ptr + 4);
    }
    gost_key(c,(byte *)ptr);
    c[1].master_key[7] = 1;
  }
  else {
    if (type != 0x1003) {
      return 0;
    }
    *(undefined4 *)ptr = 0x20;
  }
  return 1;
}

Assistant:

static int gost_imit_ctrl(EVP_MD_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_MD_CTRL_KEY_LEN:
        *((unsigned int *)(ptr)) = 32;
        return 1;
    case EVP_MD_CTRL_SET_KEY:
        {
            struct ossl_gost_imit_ctx *gost_imit_ctx = EVP_MD_CTX_md_data(ctx);

            if (EVP_MD_meth_get_init(EVP_MD_CTX_md(ctx)) (ctx) <= 0) {
                GOSTerr(GOST_F_GOST_IMIT_CTRL, GOST_R_MAC_KEY_NOT_SET);
                return 0;
            }
            EVP_MD_CTX_set_flags(ctx, EVP_MD_CTX_FLAG_NO_INIT);

            if (arg == 0) {
                struct gost_mac_key *key = (struct gost_mac_key *)ptr;
                if (key->mac_param_nid != NID_undef) {
                    const struct gost_cipher_info *param =
                        get_encryption_params(OBJ_nid2obj(key->mac_param_nid));
                    if (param == NULL) {
                        GOSTerr(GOST_F_GOST_IMIT_CTRL,
                                GOST_R_INVALID_MAC_PARAMS);
                        return 0;
                    }
                    gost_init(&(gost_imit_ctx->cctx), param->sblock);
                }
                gost_key(&(gost_imit_ctx->cctx), key->key);
                gost_imit_ctx->key_set = 1;

                return 1;
            } else if (arg == 32) {
                gost_key(&(gost_imit_ctx->cctx), ptr);
                gost_imit_ctx->key_set = 1;
                return 1;
            }
            GOSTerr(GOST_F_GOST_IMIT_CTRL, GOST_R_INVALID_MAC_KEY_SIZE);
            return 0;
        }
    case EVP_MD_CTRL_XOF_LEN:
        {
            struct ossl_gost_imit_ctx *c = EVP_MD_CTX_md_data(ctx);
            if (arg < 1 || arg > 8) {
                GOSTerr(GOST_F_GOST_IMIT_CTRL, GOST_R_INVALID_MAC_SIZE);
                return 0;
            }
            c->dgst_size = arg;
            return 1;
        }

    default:
        return 0;
    }
}